

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOcontroller.h
# Opt level: O0

string * IOcontroller::get_out_file_name_budget
                   (string *__return_storage_ptr__,string *graphName,string *algName,
                   double budpercent,double normalpha,double percent,double eps,double feps,
                   string *probDist,float probEdge)

{
  bool bVar1;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  float local_54;
  string *psStack_50;
  float probEdge_local;
  string *probDist_local;
  double feps_local;
  double eps_local;
  double percent_local;
  double normalpha_local;
  double budpercent_local;
  string *algName_local;
  string *graphName_local;
  
  local_54 = probEdge;
  psStack_50 = probDist;
  probDist_local = (string *)feps;
  feps_local = eps;
  eps_local = percent;
  percent_local = normalpha;
  normalpha_local = budpercent;
  budpercent_local = (double)algName;
  algName_local = graphName;
  graphName_local = __return_storage_ptr__;
  bVar1 = std::operator==(probDist,"UNI");
  if (bVar1) {
    std::operator+(&local_218,graphName,"_");
    std::operator+(&local_1f8,&local_218,algName);
    std::operator+(&local_1d8,&local_1f8,"_");
    std::__cxx11::to_string(&local_248,normalpha_local);
    std::operator+(&local_1b8,&local_1d8,&local_248);
    std::operator+(&local_198,&local_1b8,"_");
    std::__cxx11::to_string(&local_268,percent_local);
    std::operator+(&local_178,&local_198,&local_268);
    std::operator+(&local_158,&local_178,"_");
    std::__cxx11::to_string(&local_288,eps_local);
    std::operator+(&local_138,&local_158,&local_288);
    std::operator+(&local_118,&local_138,"_");
    std::__cxx11::to_string(&local_2a8,feps_local);
    std::operator+(&local_f8,&local_118,&local_2a8);
    std::operator+(&local_d8,&local_f8,"_");
    std::__cxx11::to_string(&local_2c8,(double)probDist_local);
    std::operator+(&local_b8,&local_d8,&local_2c8);
    std::operator+(&local_98,&local_b8,"_");
    std::operator+(&local_78,&local_98,probDist);
    std::__cxx11::to_string(&local_2e8,local_54);
    std::operator+(__return_storage_ptr__,&local_78,&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
  }
  else {
    std::operator+(&local_488,graphName,"_");
    std::operator+(&local_468,&local_488,algName);
    std::operator+(&local_448,&local_468,"_");
    std::__cxx11::to_string(&local_4a8,normalpha_local);
    std::operator+(&local_428,&local_448,&local_4a8);
    std::operator+(&local_408,&local_428,"_");
    std::__cxx11::to_string(&local_4c8,percent_local);
    std::operator+(&local_3e8,&local_408,&local_4c8);
    std::operator+(&local_3c8,&local_3e8,"_");
    std::__cxx11::to_string(&local_4e8,eps_local);
    std::operator+(&local_3a8,&local_3c8,&local_4e8);
    std::operator+(&local_388,&local_3a8,"_");
    std::__cxx11::to_string(&local_508,feps_local);
    std::operator+(&local_368,&local_388,&local_508);
    std::operator+(&local_348,&local_368,"_");
    std::__cxx11::to_string(&local_528,(double)probDist_local);
    std::operator+(&local_328,&local_348,&local_528);
    std::operator+(&local_308,&local_328,"_");
    std::operator+(__return_storage_ptr__,&local_308,probDist);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_488);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string get_out_file_name_budget(const std::string graphName, const std::string algName,
            const double budpercent, const double normalpha, const double percent, const double eps,
            const double feps, const std::string probDist, const float probEdge) {
        if (probDist == "UNI") {
            return graphName + "_" + algName + "_" + std::to_string(budpercent) +
                   "_" + std::to_string(normalpha) + "_" + std::to_string(percent) +
                   "_" + std::to_string(eps) + "_" + std::to_string(feps) +
                   "_" + probDist + std::to_string(probEdge);
        }
        return graphName + "_" + algName + "_" + std::to_string(budpercent) +
               "_" + std::to_string(normalpha) + "_" + std::to_string(percent) +
               "_" + std::to_string(eps) + "_" + std::to_string(feps) + "_" + probDist;
    }